

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::write_obj_id(CTcDataStream *this,ulong obj_id)

{
  if ((obj_id != 0) && (G_keep_objfixups != 0)) {
    CTcIdFixup::add_fixup(&G_objfixup,this,this->ofs_,obj_id);
  }
  write4(this,obj_id);
  return;
}

Assistant:

void CTcDataStream::write_obj_id(ulong obj_id)
{
    /* 
     *   if there's an object ID fixup list, and this is a valid object
     *   reference (not a 'nil' reference), add this reference 
     */
    if (G_keep_objfixups && obj_id != TCTARG_INVALID_OBJ)
        CTcIdFixup::add_fixup(&G_objfixup, this, get_ofs(), obj_id);

    /* write the ID */
    write4(obj_id);
}